

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ac3StreamReader.cpp
# Opt level: O0

int __thiscall AC3StreamReader::readPacketTHD(AC3StreamReader *this,AVPacket *avPacket)

{
  int64_t iVar1;
  bool bVar2;
  CodecInfo *pCVar3;
  ostream *poVar4;
  uint8_t *puVar5;
  long lVar6;
  string local_48;
  undefined1 local_25;
  int local_24;
  bool isAc3Packet;
  AVPacket *pAStack_20;
  int rez;
  AVPacket *avPacket_local;
  AC3StreamReader *this_local;
  
  pAStack_20 = avPacket;
  avPacket_local = (AVPacket *)this;
  if (((this->m_thdDemuxWaitAc3 & 1U) == 0) ||
     (bVar2 = MemoryBlock::isEmpty(&this->m_delayedAc3Buffer), bVar2)) {
    while (local_24 = SimplePacketizerReader::readPacket
                                (&this->super_SimplePacketizerReader,pAStack_20),
          this_local._4_4_ = local_24, local_24 == 0) {
      local_25 = (this->super_AC3Codec).m_state == stateDecodeTrueHDFirst;
      if (!(bool)local_25) {
        lVar6 = (this->m_totalTHDSamples * 0x13b6d8300) /
                (long)(this->super_AC3Codec).mlp.m_samplerate;
        pAStack_20->pts = lVar6;
        pAStack_20->dts = lVar6;
        this->m_totalTHDSamples =
             (long)(this->super_AC3Codec).mlp.m_samples + this->m_totalTHDSamples;
        this->m_demuxedTHDSamples = (this->super_AC3Codec).mlp.m_samples + this->m_demuxedTHDSamples
        ;
        if ((this->super_AC3Codec).m_samples <= this->m_demuxedTHDSamples) {
          this->m_demuxedTHDSamples = this->m_demuxedTHDSamples - (this->super_AC3Codec).m_samples;
          this->m_thdDemuxWaitAc3 = true;
        }
        return 0;
      }
      if ((this->m_thdDemuxWaitAc3 & 1U) != 0) {
        this->m_thdDemuxWaitAc3 = false;
        iVar1 = this->m_nextAc3Time;
        pAStack_20->pts = iVar1;
        pAStack_20->dts = iVar1;
        pAStack_20->flags = pAStack_20->flags | 0x40;
        this->m_nextAc3Time = (this->super_AC3Codec).m_frameDuration + this->m_nextAc3Time;
        return 0;
      }
      bVar2 = MemoryBlock::isEmpty(&this->m_delayedAc3Buffer);
      if (!bVar2) {
        pCVar3 = getCodecInfo(this);
        poVar4 = std::operator<<((ostream *)&std::cout,(string *)&pCVar3->displayName);
        poVar4 = std::operator<<(poVar4," stream (track ");
        poVar4 = (ostream *)
                 std::ostream::operator<<
                           (poVar4,(this->super_SimplePacketizerReader).super_AbstractStreamReader.
                                   m_streamIndex);
        poVar4 = std::operator<<(poVar4,"): overlapped frame detected at position ");
        floatToTime_abi_cxx11_(&local_48,(double)pAStack_20->pts / 5292000000.0,',');
        poVar4 = std::operator<<(poVar4,(string *)&local_48);
        poVar4 = std::operator<<(poVar4,". Remove frame.");
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        std::__cxx11::string::~string((string *)&local_48);
        sLastMsg = true;
      }
      memcpy(&this->m_delayedAc3Packet,pAStack_20,0x4c);
      MemoryBlock::clear(&this->m_delayedAc3Buffer);
      MemoryBlock::append(&this->m_delayedAc3Buffer,pAStack_20->data,(long)pAStack_20->size);
      puVar5 = MemoryBlock::data(&this->m_delayedAc3Buffer);
      (this->m_delayedAc3Packet).data = puVar5;
    }
  }
  else {
    memcpy(pAStack_20,&this->m_delayedAc3Packet,0x4c);
    MemoryBlock::clear(&this->m_delayedAc3Buffer);
    this->m_thdDemuxWaitAc3 = false;
    iVar1 = this->m_nextAc3Time;
    pAStack_20->pts = iVar1;
    pAStack_20->dts = iVar1;
    pAStack_20->flags = pAStack_20->flags | 0x40;
    this->m_nextAc3Time = (this->super_AC3Codec).m_frameDuration + this->m_nextAc3Time;
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

int AC3StreamReader::readPacketTHD(AVPacket& avPacket)
{
    if (m_thdDemuxWaitAc3 && !m_delayedAc3Buffer.isEmpty())
    {
        avPacket = m_delayedAc3Packet;
        m_delayedAc3Buffer.clear();
        m_thdDemuxWaitAc3 = false;
        avPacket.dts = avPacket.pts = m_nextAc3Time;
        avPacket.flags |= AVPacket::IS_CORE_PACKET;
        m_nextAc3Time += m_frameDuration;
        return 0;
    }

    while (true)
    {
        const int rez = SimplePacketizerReader::readPacket(avPacket);
        if (rez != 0)
            return rez;

        const bool isAc3Packet = (m_state == AC3State::stateDecodeTrueHDFirst);

        if (isAc3Packet)
        {
            if (m_thdDemuxWaitAc3)
            {
                m_thdDemuxWaitAc3 = false;
                avPacket.dts = avPacket.pts = m_nextAc3Time;
                avPacket.flags |= AVPacket::IS_CORE_PACKET;
                m_nextAc3Time += m_frameDuration;
                return 0;
            }
            if (!m_delayedAc3Buffer.isEmpty())
            {
                LTRACE(LT_INFO, 2,
                       getCodecInfo().displayName
                           << " stream (track " << m_streamIndex << "): overlapped frame detected at position "
                           << floatToTime((double)(avPacket.pts - PTS_CONST_OFFSET) / INTERNAL_PTS_FREQ, ',')
                           << ". Remove frame.");
            }

            m_delayedAc3Packet = avPacket;
            m_delayedAc3Buffer.clear();
            m_delayedAc3Buffer.append(avPacket.data, avPacket.size);
            m_delayedAc3Packet.data = m_delayedAc3Buffer.data();
        }
        else
        {
            // thg packet
            avPacket.dts = avPacket.pts = m_totalTHDSamples * INTERNAL_PTS_FREQ / mlp.m_samplerate;

            m_totalTHDSamples += mlp.m_samples;
            m_demuxedTHDSamples += mlp.m_samples;
            if (m_demuxedTHDSamples >= m_samples)
            {
                m_demuxedTHDSamples -= m_samples;
                m_thdDemuxWaitAc3 = true;
            }
            return 0;
        }
    }
}